

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_bind.cpp
# Opt level: O2

void C_NameKeys(char *str,int first,int second)

{
  char *pcVar1;
  size_t sVar2;
  
  *str = '\0';
  if (first == 0) {
    if (second == 0) {
      return;
    }
  }
  else {
    pcVar1 = KeyName(first);
    strcpy(str,pcVar1);
    if (second == 0) {
      return;
    }
    sVar2 = strlen(str);
    builtin_strncpy(str + sVar2," or ",5);
  }
  pcVar1 = KeyName(second);
  strcat(str,pcVar1);
  return;
}

Assistant:

void C_NameKeys (char *str, int first, int second)
{
	int c = 0;

	*str = 0;
	if (first)
	{
		c++;
		strcpy (str, KeyName (first));
		if (second)
			strcat (str, " or ");
	}

	if (second)
	{
		c++;
		strcat (str, KeyName (second));
	}

	if (!c)
		*str = '\0';
}